

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::TagAliasRegistry::expandAliases
          (string *__return_storage_ptr__,TagAliasRegistry *this,string *unexpandedTestSpec)

{
  long lVar1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Rb_tree_node_base *local_40;
  string *local_38;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)unexpandedTestSpec);
  local_40 = &(this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38 = __return_storage_ptr__;
  for (p_Var2 = (this->m_registry)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 != local_40; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    lVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)(p_Var2 + 1));
    if (lVar1 != -1) {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)__return_storage_ptr__);
      std::operator+(&local_80,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var2 + 2));
      __return_storage_ptr__ = local_38;
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_38);
      std::operator+(&local_c0,&local_80,&local_a0);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagAliasRegistry::expandAliases(std::string const& unexpandedTestSpec) const {
		std::string expandedTestSpec = unexpandedTestSpec;
		for (std::map<std::string, TagAlias>::const_iterator it = m_registry.begin(), itEnd = m_registry.end();
			it != itEnd;
			++it) {
			std::size_t pos = expandedTestSpec.find(it->first);
			if (pos != std::string::npos) {
				expandedTestSpec = expandedTestSpec.substr(0, pos) +
					it->second.tag +
					expandedTestSpec.substr(pos + it->first.size());
			}
		}
		return expandedTestSpec;
	}